

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O3

void JoinGame(int i)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = DArgs::NumArgs(Args);
  if (iVar1 + -1 != i) {
    pcVar2 = DArgs::GetArg(Args,i + 1);
    if ((*pcVar2 != '-') && (pcVar2 = DArgs::GetArg(Args,i + 1), *pcVar2 != '+')) goto LAB_004ed3d3;
  }
  I_FatalError("You need to specify the host machine\'s address");
LAB_004ed3d3:
  StartNetwork(true);
  pcVar2 = DArgs::GetArg(Args,i + 1);
  BuildAddress(sendaddress + 1,pcVar2);
  sendplayer[1] = '\0';
  doomcom.numnodes = 2;
  addterm(SendAbort,"SendAbort");
  (*StartScreen->_vptr_FStartupScreen[5])(StartScreen,"Contacting host",0);
  iVar1 = (*StartScreen->_vptr_FStartupScreen[9])(StartScreen,Guest_ContactHost,0);
  if (((char)iVar1 != '\0') &&
     (iVar1 = (*StartScreen->_vptr_FStartupScreen[9])(StartScreen,Guest_WaitForOthers,0),
     (char)iVar1 != '\0')) {
    popterm();
    (*StartScreen->_vptr_FStartupScreen[7])
              (StartScreen,"Total players: %d",(ulong)(uint)(int)doomcom.numnodes);
    doomcom.id = 0x12345678;
    doomcom.numplayers = doomcom.numnodes;
    return;
  }
  exit(0);
}

Assistant:

void JoinGame (int i)
{
	if ((i == Args->NumArgs() - 1) ||
		(Args->GetArg(i+1)[0] == '-') ||
		(Args->GetArg(i+1)[0] == '+'))
		I_FatalError ("You need to specify the host machine's address");

	StartNetwork (true);

	// Host is always node 1
	BuildAddress (&sendaddress[1], Args->GetArg(i+1));
	sendplayer[1] = 0;
	doomcom.numnodes = 2;

	atterm (SendAbort);

	// Let host know we are here
	StartScreen->NetInit ("Contacting host", 0);

	if (!StartScreen->NetLoop (Guest_ContactHost, NULL))
	{
		exit (0);
	}

	// Wait for everyone else to connect
	if (!StartScreen->NetLoop (Guest_WaitForOthers, 0))
	{
		exit (0);
	}

	popterm ();

	StartScreen->NetMessage ("Total players: %d", doomcom.numnodes);

	doomcom.id = DOOMCOM_ID;
	doomcom.numplayers = doomcom.numnodes;
}